

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O2

size_t __thiscall
dg::ADT::
SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
::size(SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
       *this)

{
  size_t sVar1;
  __node_base *p_Var2;
  size_t sVar3;
  
  p_Var2 = &(this->_bits).
            super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
            .
            super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ._M_h._M_before_begin;
  sVar3 = 0;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    sVar1 = _countBits((unsigned_long)
                       *(_Hash_node_base **)
                        &((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor);
    sVar3 = sVar3 + sVar1;
  }
  return sVar3;
}

Assistant:

size_t size() const {
        size_t num = 0;
        for (auto &it : _bits)
            num += _countBits(it.second);

        return num;
    }